

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KinDynComputations.cpp
# Opt level: O3

bool __thiscall
iDynTree::KinDynComputations::getLinearAngularMomentumJacobian
          (KinDynComputations *this,MatrixView<double> *linAngMomentumJacobian)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  Index row;
  long lVar5;
  pointer peVar6;
  pointer peVar7;
  Index col;
  long lVar8;
  MatrixView<double> local_88;
  MatrixView<double> local_58;
  
  if ((linAngMomentumJacobian->m_rows == 6) &&
     (lVar3 = linAngMomentumJacobian->m_cols, lVar1 = iDynTree::Model::getNrOfDOFs(),
     lVar3 == lVar1 + 6)) {
    computeRawMassMatrixAndTotalMomentum(this);
    lVar1 = iDynTree::MatrixDynSize::data();
    iDynTree::MatrixDynSize::rows();
    lVar2 = iDynTree::MatrixDynSize::cols();
    iDynTree::Model::getNrOfDOFs();
    local_58.m_storageOrder = linAngMomentumJacobian->m_storageOrder;
    local_58.m_cols = linAngMomentumJacobian->m_cols;
    local_58.m_storage = linAngMomentumJacobian->m_storage;
    local_58.m_rows = linAngMomentumJacobian->m_rows;
    lVar3 = 1;
    if (local_58.m_storageOrder == ColumnMajor) {
      lVar3 = local_58.m_rows;
    }
    lVar4 = 1;
    if (local_58.m_storageOrder != ColumnMajor) {
      lVar4 = local_58.m_cols;
    }
    if (0 < local_58.m_rows) {
      lVar5 = 0;
      peVar6 = local_58.m_storage;
      do {
        if (0 < local_58.m_cols) {
          lVar8 = 0;
          peVar7 = peVar6;
          do {
            *peVar7 = *(element_type *)(lVar1 + lVar8 * 8);
            lVar8 = lVar8 + 1;
            peVar7 = peVar7 + lVar3;
          } while (local_58.m_cols != lVar8);
        }
        lVar5 = lVar5 + 1;
        lVar1 = lVar1 + lVar2 * 8;
        peVar6 = peVar6 + lVar4;
      } while (lVar5 != local_58.m_rows);
    }
    local_58.m_innerStride = linAngMomentumJacobian->m_innerStride;
    local_58.m_outerStride = linAngMomentumJacobian->m_outerStride;
    KinDynComputationsPrivateAttributes::processOnRightSideMatrixExpectingBodyFixedModelVelocity
              (this->pimpl,&local_58);
    local_88.m_storage = linAngMomentumJacobian->m_storage;
    local_88.m_rows = linAngMomentumJacobian->m_rows;
    local_88.m_cols = linAngMomentumJacobian->m_cols;
    local_88.m_storageOrder = linAngMomentumJacobian->m_storageOrder;
    local_88.m_innerStride = linAngMomentumJacobian->m_innerStride;
    local_88.m_outerStride = linAngMomentumJacobian->m_outerStride;
    KinDynComputationsPrivateAttributes::processOnLeftSideBodyFixedBaseMomentumJacobian
              (this->pimpl,&local_88);
    return true;
  }
  iDynTree::reportError
            ("KinDynComputations","getLinearAngularMomentumJacobian",
             "Wrong size in input linAngMomentumJacobian");
  return false;
}

Assistant:

bool KinDynComputations::getLinearAngularMomentumJacobian(MatrixView<double> linAngMomentumJacobian)
{
    bool ok = (linAngMomentumJacobian.rows() == 6)
        && (linAngMomentumJacobian.cols() == pimpl->m_robot_model.getNrOfDOFs() + 6);

    if( !ok )
    {
        reportError("KinDynComputations",
                    "getLinearAngularMomentumJacobian",
                    "Wrong size in input linAngMomentumJacobian");
        return false;
    }

    this->computeRawMassMatrixAndTotalMomentum();

    toEigen(linAngMomentumJacobian) = toEigen(pimpl->m_rawMassMatrix).block(0,0,6,6+pimpl->m_robot_model.getNrOfDOFs());

    // Handle the different representations
    pimpl->processOnRightSideMatrixExpectingBodyFixedModelVelocity(linAngMomentumJacobian);
    pimpl->processOnLeftSideBodyFixedBaseMomentumJacobian(linAngMomentumJacobian);

    return true;
}